

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::sse2::SphereMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  int iVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  ulong uVar25;
  RTCFilterFunctionN p_Var26;
  RTCRayN *pRVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  Scene *pSVar34;
  undefined1 auVar35 [8];
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  uint uVar43;
  float fVar53;
  float fVar55;
  float fVar57;
  undefined1 auVar44 [16];
  uint uVar54;
  uint uVar56;
  uint uVar58;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar52;
  float fVar59;
  float fVar76;
  float fVar78;
  float fVar80;
  undefined1 auVar61 [16];
  uint uVar60;
  uint uVar77;
  uint uVar79;
  uint uVar81;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  float fVar100;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar96;
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  vbool<4> valid;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 (*local_208) [16];
  Scene *local_200;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  uint local_d8 [4];
  HitK<4> h;
  
  local_200 = context->scene;
  uVar60 = sphere->sharedGeomID;
  uVar25 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar10 = (local_200->geometries).items[uVar60].ptr;
  local_228 = pGVar10->fnumTimeSegments;
  fVar40 = (pGVar10->time_range).lower;
  fVar40 = ((*(float *)(ray + k * 4 + 0x70) - fVar40) / ((pGVar10->time_range).upper - fVar40)) *
           local_228;
  _local_218 = ZEXT416((uint)fVar40);
  fVar40 = floorf(fVar40);
  if (local_228 + -1.0 <= fVar40) {
    fVar40 = local_228 + -1.0;
  }
  fVar113 = 0.0;
  if (0.0 <= fVar40) {
    fVar113 = fVar40;
  }
  fVar106 = (float)local_218._0_4_ - fVar113;
  lVar30 = *(long *)&pGVar10[2].numPrimitives;
  lVar28 = (long)(int)fVar113 * 0x38;
  lVar11 = *(long *)(lVar30 + lVar28);
  lVar12 = *(long *)(lVar30 + 0x10 + lVar28);
  pfVar1 = (float *)(lVar11 + lVar12 * uVar25);
  uVar29 = (ulong)(sphere->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar11 + lVar12 * uVar29);
  uVar31 = (ulong)(sphere->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar11 + lVar12 * uVar31);
  uVar33 = (ulong)(sphere->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar11 + lVar12 * uVar33);
  lVar11 = *(long *)(lVar30 + 0x38 + lVar28);
  lVar30 = *(long *)(lVar30 + 0x48 + lVar28);
  pfVar5 = (float *)(lVar11 + uVar25 * lVar30);
  pfVar6 = (float *)(lVar11 + uVar29 * lVar30);
  pfVar7 = (float *)(lVar11 + uVar31 * lVar30);
  pfVar8 = (float *)(lVar11 + lVar30 * uVar33);
  fVar41 = 1.0 - fVar106;
  fVar42 = fVar41 * pfVar1[3] + fVar106 * pfVar5[3];
  fVar53 = fVar41 * pfVar2[3] + fVar106 * pfVar6[3];
  fVar55 = fVar41 * pfVar3[3] + fVar106 * pfVar7[3];
  fVar57 = fVar41 * pfVar4[3] + fVar106 * pfVar8[3];
  uVar77 = (uint)sphere->numPrimitives;
  local_d8[0] = uVar60;
  local_d8[1] = uVar60;
  local_d8[2] = uVar60;
  local_d8[3] = uVar60;
  fVar40 = *(float *)(ray + k * 4);
  fVar113 = *(float *)(ray + k * 4 + 0x10);
  fVar120 = *(float *)(ray + k * 4 + 0x20);
  fVar114 = (*pfVar1 * fVar41 + *pfVar5 * fVar106) - fVar40;
  fVar115 = (*pfVar2 * fVar41 + *pfVar6 * fVar106) - fVar40;
  fVar116 = (*pfVar3 * fVar41 + *pfVar7 * fVar106) - fVar40;
  fVar40 = (*pfVar4 * fVar41 + *pfVar8 * fVar106) - fVar40;
  fVar110 = (pfVar1[1] * fVar41 + pfVar5[1] * fVar106) - fVar113;
  fVar111 = (pfVar2[1] * fVar41 + pfVar6[1] * fVar106) - fVar113;
  fVar112 = (pfVar3[1] * fVar41 + pfVar7[1] * fVar106) - fVar113;
  fVar113 = (pfVar4[1] * fVar41 + pfVar8[1] * fVar106) - fVar113;
  fVar117 = (pfVar1[2] * fVar41 + pfVar5[2] * fVar106) - fVar120;
  fVar118 = (pfVar2[2] * fVar41 + pfVar6[2] * fVar106) - fVar120;
  fVar119 = (pfVar3[2] * fVar41 + pfVar7[2] * fVar106) - fVar120;
  fVar120 = (pfVar4[2] * fVar41 + pfVar8[2] * fVar106) - fVar120;
  fVar41 = *(float *)(ray + k * 4 + 0x40);
  fVar106 = *(float *)(ray + k * 4 + 0x50);
  fVar9 = *(float *)(ray + k * 4 + 0x60);
  fVar93 = fVar106 * fVar106 + fVar9 * fVar9;
  auVar102._0_4_ = fVar41 * fVar41 + fVar93;
  auVar102._4_4_ = auVar102._0_4_;
  auVar102._8_4_ = auVar102._0_4_;
  auVar102._12_4_ = auVar102._0_4_;
  auVar95 = rcpps(ZEXT416((uint)fVar93),auVar102);
  fVar59 = auVar95._0_4_;
  fVar76 = auVar95._4_4_;
  fVar78 = auVar95._8_4_;
  fVar80 = auVar95._12_4_;
  fVar59 = (1.0 - auVar102._0_4_ * fVar59) * fVar59 + fVar59;
  fVar76 = (1.0 - auVar102._0_4_ * fVar76) * fVar76 + fVar76;
  fVar78 = (1.0 - auVar102._0_4_ * fVar78) * fVar78 + fVar78;
  fVar80 = (1.0 - auVar102._0_4_ * fVar80) * fVar80 + fVar80;
  fVar93 = (fVar114 * fVar41 + fVar110 * fVar106 + fVar117 * fVar9) * fVar59;
  fVar107 = (fVar115 * fVar41 + fVar111 * fVar106 + fVar118 * fVar9) * fVar76;
  fVar108 = (fVar116 * fVar41 + fVar112 * fVar106 + fVar119 * fVar9) * fVar78;
  fVar109 = (fVar40 * fVar41 + fVar113 * fVar106 + fVar120 * fVar9) * fVar80;
  fVar114 = fVar114 - fVar41 * fVar93;
  fVar115 = fVar115 - fVar41 * fVar107;
  fVar116 = fVar116 - fVar41 * fVar108;
  fVar40 = fVar40 - fVar41 * fVar109;
  fVar110 = fVar110 - fVar106 * fVar93;
  fVar111 = fVar111 - fVar106 * fVar107;
  fVar112 = fVar112 - fVar106 * fVar108;
  fVar113 = fVar113 - fVar106 * fVar109;
  fVar117 = fVar117 - fVar9 * fVar93;
  fVar118 = fVar118 - fVar9 * fVar107;
  fVar119 = fVar119 - fVar9 * fVar108;
  fVar120 = fVar120 - fVar9 * fVar109;
  auVar101._0_4_ = fVar110 * fVar110 + fVar117 * fVar117;
  auVar101._4_4_ = fVar111 * fVar111 + fVar118 * fVar118;
  auVar101._8_4_ = fVar112 * fVar112 + fVar119 * fVar119;
  auVar101._12_4_ = fVar113 * fVar113 + fVar120 * fVar120;
  fVar94 = fVar114 * fVar114 + auVar101._0_4_;
  fVar98 = fVar115 * fVar115 + auVar101._4_4_;
  fVar99 = fVar116 * fVar116 + auVar101._8_4_;
  fVar100 = fVar40 * fVar40 + auVar101._12_4_;
  fVar42 = fVar42 * fVar42;
  fVar53 = fVar53 * fVar53;
  fVar55 = fVar55 * fVar55;
  fVar57 = fVar57 * fVar57;
  bVar18 = uVar77 != 0 && fVar94 <= fVar42;
  auVar95._0_4_ = -(uint)bVar18;
  bVar19 = 1 < uVar77 && fVar98 <= fVar53;
  auVar95._4_4_ = -(uint)bVar19;
  bVar16 = 2 < uVar77 && fVar99 <= fVar55;
  auVar95._8_4_ = -(uint)bVar16;
  bVar14 = 3 < uVar77 && fVar100 <= fVar57;
  auVar95._12_4_ = -(uint)bVar14;
  iVar22 = movmskps(uVar77,auVar95);
  if (iVar22 != 0) {
    auVar61._0_4_ = fVar59 * (fVar42 - fVar94);
    auVar61._4_4_ = fVar76 * (fVar53 - fVar98);
    auVar61._8_4_ = fVar78 * (fVar55 - fVar99);
    auVar61._12_4_ = fVar80 * (fVar57 - fVar100);
    auVar102 = sqrtps(auVar101,auVar61);
    fVar55 = auVar102._0_4_;
    fVar78 = fVar93 - fVar55;
    fVar57 = auVar102._4_4_;
    fVar80 = fVar107 - fVar57;
    fVar59 = auVar102._8_4_;
    fVar94 = fVar108 - fVar59;
    fVar76 = auVar102._12_4_;
    fVar98 = fVar109 - fVar76;
    fVar93 = fVar93 + fVar55;
    fVar107 = fVar107 + fVar57;
    fVar108 = fVar108 + fVar59;
    fVar109 = fVar109 + fVar76;
    fVar42 = *(float *)(ray + k * 4 + 0x30);
    fVar53 = *(float *)(ray + k * 4 + 0x80);
    bVar20 = fVar42 <= fVar78 && fVar78 <= fVar53;
    bVar21 = fVar42 <= fVar80 && fVar80 <= fVar53;
    bVar17 = fVar42 <= fVar94 && fVar94 <= fVar53;
    bVar15 = fVar42 <= fVar98 && fVar98 <= fVar53;
    uVar60 = -(uint)(bVar20 && bVar18);
    uVar77 = -(uint)(bVar21 && bVar19);
    auVar44._4_4_ = uVar77;
    auVar44._0_4_ = uVar60;
    uVar79 = -(uint)(bVar17 && bVar16);
    uVar81 = -(uint)(bVar15 && bVar14);
    bVar18 = (fVar42 <= fVar93 && fVar93 <= fVar53) && bVar18;
    auVar104._0_4_ = -(uint)bVar18;
    bVar19 = (fVar42 <= fVar107 && fVar107 <= fVar53) && bVar19;
    auVar104._4_4_ = -(uint)bVar19;
    bVar16 = (fVar42 <= fVar108 && fVar108 <= fVar53) && bVar16;
    auVar104._8_4_ = -(uint)bVar16;
    bVar14 = (fVar42 <= fVar109 && fVar109 <= fVar53) && bVar14;
    auVar104._12_4_ = -(uint)bVar14;
    auVar44._8_4_ = uVar79;
    auVar44._12_4_ = uVar81;
    valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar44 | auVar104);
    iVar22 = movmskps(iVar22,(undefined1  [16])valid.field_0);
    if (iVar22 != 0) {
      hit.vt.field_0.i[0] = (uint)fVar78 & uVar60 | ~uVar60 & (uint)fVar93;
      hit.vt.field_0.i[1] = (uint)fVar80 & uVar77 | ~uVar77 & (uint)fVar107;
      hit.vt.field_0.i[2] = (uint)fVar94 & uVar79 | ~uVar79 & (uint)fVar108;
      hit.vt.field_0.i[3] = (uint)fVar98 & uVar81 | ~uVar81 & (uint)fVar109;
      fVar42 = (float)(~uVar60 & (uint)fVar55 | (uint)-fVar55 & uVar60);
      fVar78 = (float)(~uVar77 & (uint)fVar57 | (uint)-fVar57 & uVar77);
      fVar80 = (float)(~uVar79 & (uint)fVar59 | (uint)-fVar59 & uVar79);
      fVar94 = (float)(~uVar81 & (uint)fVar76 | (uint)-fVar76 & uVar81);
      hit.vNg.field_0._0_4_ = fVar41 * fVar42 - fVar114;
      hit.vNg.field_0._4_4_ = fVar41 * fVar78 - fVar115;
      hit.vNg.field_0._8_4_ = fVar41 * fVar80 - fVar116;
      hit.vNg.field_0._12_4_ = fVar41 * fVar94 - fVar40;
      hit.vNg.field_0._16_4_ = fVar106 * fVar42 - fVar110;
      hit.vNg.field_0._20_4_ = fVar106 * fVar78 - fVar111;
      hit.vNg.field_0._24_4_ = fVar106 * fVar80 - fVar112;
      hit.vNg.field_0._28_4_ = fVar106 * fVar94 - fVar113;
      hit.vNg.field_0._32_4_ = fVar42 * fVar9 - fVar117;
      hit.vNg.field_0._36_4_ = fVar78 * fVar9 - fVar118;
      hit.vNg.field_0._40_4_ = fVar80 * fVar9 - fVar119;
      hit.vNg.field_0._44_4_ = fVar94 * fVar9 - fVar120;
      local_218._4_4_ = hit.vt.field_0.i[1];
      local_218._0_4_ = hit.vt.field_0.i[0];
      fStack_210 = (float)hit.vt.field_0.i[2];
      fStack_20c = (float)hit.vt.field_0.i[3];
      uVar43 = valid.field_0._0_4_;
      auVar62._0_4_ = hit.vt.field_0.i[0] & uVar43;
      uVar54 = valid.field_0._4_4_;
      auVar62._4_4_ = hit.vt.field_0.i[1] & uVar54;
      uVar56 = valid.field_0._8_4_;
      auVar62._8_4_ = hit.vt.field_0.i[2] & uVar56;
      uVar58 = valid.field_0._12_4_;
      auVar62._12_4_ = hit.vt.field_0.i[3] & uVar58;
      auVar82._0_8_ = CONCAT44(~uVar54,~uVar43) & 0x7f8000007f800000;
      auVar82._8_4_ = ~uVar56 & 0x7f800000;
      auVar82._12_4_ = ~uVar58 & 0x7f800000;
      auVar82 = auVar82 | auVar62;
      auVar90._4_4_ = auVar82._0_4_;
      auVar90._0_4_ = auVar82._4_4_;
      auVar90._8_4_ = auVar82._12_4_;
      auVar90._12_4_ = auVar82._8_4_;
      auVar102 = minps(auVar90,auVar82);
      auVar63._0_8_ = auVar102._8_8_;
      auVar63._8_4_ = auVar102._0_4_;
      auVar63._12_4_ = auVar102._4_4_;
      auVar102 = minps(auVar63,auVar102);
      uVar36 = -(uint)(auVar102._0_4_ == auVar82._0_4_);
      uVar37 = -(uint)(auVar102._4_4_ == auVar82._4_4_);
      uVar38 = -(uint)(auVar102._8_4_ == auVar82._8_4_);
      uVar39 = -(uint)(auVar102._12_4_ == auVar82._12_4_);
      auVar83._0_4_ = uVar36 & uVar43;
      auVar83._4_4_ = uVar37 & uVar54;
      auVar83._8_4_ = uVar38 & uVar56;
      auVar83._12_4_ = uVar39 & uVar58;
      iVar22 = movmskps(iVar22,auVar83);
      uVar60 = 0xffffffff;
      uVar77 = 0xffffffff;
      uVar79 = 0xffffffff;
      uVar81 = 0xffffffff;
      if (iVar22 != 0) {
        uVar60 = uVar36;
        uVar77 = uVar37;
        uVar79 = uVar38;
        uVar81 = uVar39;
      }
      auVar45._0_4_ = uVar43 & uVar60;
      auVar45._4_4_ = uVar54 & uVar77;
      auVar45._8_4_ = uVar56 & uVar79;
      auVar45._12_4_ = uVar58 & uVar81;
      uVar60 = movmskps(iVar22,auVar45);
      lVar30 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
        }
      }
      pauVar32 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      pSVar34 = local_200;
      do {
        args.hit = (RTCHitN *)&h;
        args.valid = (int *)local_238;
        h.geomID.field_0.i[0] = local_d8[lVar30];
        uVar25 = (ulong)h.geomID.field_0.i[0];
        pGVar10 = (pSVar34->geometries).items[uVar25].ptr;
        args.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_238 + lVar30 * 4 + -0x10) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar53 = hit.vt.field_0.v[lVar30];
            *(float *)(ray + k * 4 + 0x80) = fVar53;
            *(undefined4 *)(ray + k * 4 + 0xc0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0xe0) =
                 *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x20);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar30];
            *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar60 = context->user->instPrimID[0];
            uVar24 = 0;
            *(uint *)(ray + k * 4 + 0x140) = uVar60;
LAB_0033f92e:
            bVar18 = (fVar93 <= fVar53 && bVar20) && bVar18;
            valid.field_0.i[0] = -(uint)bVar18;
            bVar19 = (fVar107 <= fVar53 && bVar21) && bVar19;
            valid.field_0.i[1] = -(uint)bVar19;
            bVar16 = (fVar108 <= fVar53 && bVar17) && bVar16;
            valid.field_0.i[2] = -(uint)bVar16;
            bVar14 = (fVar109 <= fVar53 && bVar15) && bVar14;
            valid.field_0.i[3] = -(uint)bVar14;
            iVar22 = movmskps(uVar60,(undefined1  [16])valid.field_0);
            if (iVar22 == 0) {
              return;
            }
            hit.vt.field_0.v[0] = fVar93;
            hit.vt.field_0.v[1] = fVar107;
            hit.vt.field_0.v[2] = fVar108;
            hit.vt.field_0.v[3] = fVar109;
            hit.vNg.field_0._0_4_ = fVar41 * fVar55 - fVar114;
            hit.vNg.field_0._4_4_ = fVar41 * fVar57 - fVar115;
            hit.vNg.field_0._8_4_ = fVar41 * fVar59 - fVar116;
            hit.vNg.field_0._12_4_ = fVar41 * fVar76 - fVar40;
            hit.vNg.field_0._16_4_ = fVar106 * fVar55 - fVar110;
            hit.vNg.field_0._20_4_ = fVar106 * fVar57 - fVar111;
            hit.vNg.field_0._24_4_ = fVar106 * fVar59 - fVar112;
            hit.vNg.field_0._28_4_ = fVar106 * fVar76 - fVar113;
            hit.vNg.field_0._32_4_ = fVar9 * fVar55 - fVar117;
            hit.vNg.field_0._36_4_ = fVar9 * fVar57 - fVar118;
            hit.vNg.field_0._40_4_ = fVar9 * fVar59 - fVar119;
            hit.vNg.field_0._44_4_ = fVar9 * fVar76 - fVar120;
            auVar35 = (undefined1  [8])context->scene;
            auVar48._0_4_ = (uint)fVar93 & valid.field_0.i[0];
            auVar48._4_4_ = (uint)fVar107 & valid.field_0.i[1];
            auVar48._8_4_ = (uint)fVar108 & valid.field_0.i[2];
            auVar48._12_4_ = (uint)fVar109 & valid.field_0.i[3];
            auVar69._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
            auVar69._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
            auVar69._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
            auVar69 = auVar69 | auVar48;
            auVar85._4_4_ = auVar69._0_4_;
            auVar85._0_4_ = auVar69._4_4_;
            auVar85._8_4_ = auVar69._12_4_;
            auVar85._12_4_ = auVar69._8_4_;
            auVar102 = minps(auVar85,auVar69);
            auVar49._0_8_ = auVar102._8_8_;
            auVar49._8_4_ = auVar102._0_4_;
            auVar49._12_4_ = auVar102._4_4_;
            auVar102 = minps(auVar49,auVar102);
            auVar50._0_8_ =
                 CONCAT44(-(uint)(auVar102._4_4_ == auVar69._4_4_ && bVar19),
                          -(uint)(auVar102._0_4_ == auVar69._0_4_ && bVar18));
            auVar50._8_4_ = -(uint)(auVar102._8_4_ == auVar69._8_4_ && bVar16);
            auVar50._12_4_ = -(uint)(auVar102._12_4_ == auVar69._12_4_ && bVar14);
            iVar22 = movmskps(iVar22,auVar50);
            aVar96 = valid.field_0;
            if (iVar22 != 0) {
              aVar96.i[2] = auVar50._8_4_;
              aVar96._0_8_ = auVar50._0_8_;
              aVar96.i[3] = auVar50._12_4_;
            }
            uVar23 = movmskps(iVar22,(undefined1  [16])aVar96);
            lVar30 = 0;
            if (CONCAT44(uVar24,uVar23) != 0) {
              for (; (CONCAT44(uVar24,uVar23) >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            do {
              args.hit = (RTCHitN *)&h;
              args.valid = (int *)local_238;
              h.geomID.field_0.i[0] = local_d8[lVar30];
              uVar25 = (ulong)h.geomID.field_0.i[0];
              pGVar10 = (((Scene *)auVar35)->geometries).items[uVar25].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_238 + lVar30 * 4 + -0x10) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar30];
                  *(undefined4 *)(ray + k * 4 + 0xc0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x10);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x20);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar30];
                  *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                h.primID.field_0.i[0] = *(uint *)((long)&(sphere->primIDs).field_0 + lVar30 * 4);
                h.Ng.field_0._0_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4);
                h.Ng.field_0._16_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x10);
                uVar24 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x20);
                h.Ng.field_0._36_4_ = uVar24;
                h.Ng.field_0._32_4_ = uVar24;
                h.Ng.field_0._40_4_ = uVar24;
                h.Ng.field_0._44_4_ = uVar24;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
                h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
                h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
                h.v.field_0._0_8_ = 0;
                h.v.field_0._8_8_ = 0;
                h.u.field_0._0_8_ = 0;
                h.u.field_0._8_8_ = 0;
                h.primID.field_0.i[1] = h.primID.field_0.i[0];
                h.primID.field_0.i[2] = h.primID.field_0.i[0];
                h.primID.field_0.i[3] = h.primID.field_0.i[0];
                h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
                h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
                h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
                h.instID[0].field_0.i[0] = context->user->instID[0];
                h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar30];
                local_238 = *pauVar32;
                args.geometryUserPtr = pGVar10->userPtr;
                args.context = context->user;
                args.N = 4;
                p_Var26 = pGVar10->intersectionFilterN;
                local_218 = auVar35;
                local_228 = fVar93;
                fStack_224 = fVar107;
                fStack_220 = fVar108;
                fStack_21c = fVar109;
                args.ray = (RTCRayN *)ray;
                if (p_Var26 != (RTCFilterFunctionN)0x0) {
                  local_208 = pauVar32;
                  p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&args);
                  pauVar32 = local_208;
                  auVar35 = local_218;
                }
                auVar70._0_4_ = -(uint)(local_238._0_4_ == 0);
                auVar70._4_4_ = -(uint)(local_238._4_4_ == 0);
                auVar70._8_4_ = -(uint)(local_238._8_4_ == 0);
                auVar70._12_4_ = -(uint)(local_238._12_4_ == 0);
                uVar60 = movmskps((int)p_Var26,auVar70);
                pRVar27 = (RTCRayN *)(ulong)(uVar60 ^ 0xf);
                if ((uVar60 ^ 0xf) == 0) {
                  auVar13._8_4_ = 0xffffffff;
                  auVar13._0_8_ = 0xffffffffffffffff;
                  auVar13._12_4_ = 0xffffffff;
                  auVar71 = auVar70 ^ auVar13;
                  fVar93 = local_228;
                  fVar107 = fStack_224;
                  fVar108 = fStack_220;
                  fVar109 = fStack_21c;
                }
                else {
                  p_Var26 = context->args->filter;
                  if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&args);
                    auVar35 = local_218;
                  }
                  auVar51._0_4_ = -(uint)(local_238._0_4_ == 0);
                  auVar51._4_4_ = -(uint)(local_238._4_4_ == 0);
                  auVar51._8_4_ = -(uint)(local_238._8_4_ == 0);
                  auVar51._12_4_ = -(uint)(local_238._12_4_ == 0);
                  auVar71._8_4_ = 0xffffffff;
                  auVar71._0_8_ = 0xffffffffffffffff;
                  auVar71._12_4_ = 0xffffffff;
                  auVar71 = auVar51 ^ auVar71;
                  uVar60 = movmskps((int)p_Var26,auVar51);
                  pRVar27 = (RTCRayN *)(ulong)(uVar60 ^ 0xf);
                  fVar93 = local_228;
                  fVar107 = fStack_224;
                  fVar108 = fStack_220;
                  fVar109 = fStack_21c;
                  if ((uVar60 ^ 0xf) != 0) {
                    auVar86._0_4_ = *(uint *)(args.ray + 0xc0) & auVar51._0_4_;
                    auVar86._4_4_ = *(uint *)(args.ray + 0xc4) & auVar51._4_4_;
                    auVar86._8_4_ = *(uint *)(args.ray + 200) & auVar51._8_4_;
                    auVar86._12_4_ = *(uint *)(args.ray + 0xcc) & auVar51._12_4_;
                    auVar105._0_4_ = ~auVar51._0_4_ & *(uint *)args.hit;
                    auVar105._4_4_ = ~auVar51._4_4_ & *(uint *)(args.hit + 4);
                    auVar105._8_4_ = ~auVar51._8_4_ & *(uint *)(args.hit + 8);
                    auVar105._12_4_ = ~auVar51._12_4_ & *(uint *)(args.hit + 0xc);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar105 | auVar86;
                    uVar60 = *(uint *)(args.hit + 0x14);
                    uVar77 = *(uint *)(args.hit + 0x18);
                    uVar79 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar51._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar51._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar51._4_4_ & uVar60 | *(uint *)(args.ray + 0xd4) & auVar51._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar51._8_4_ & uVar77 | *(uint *)(args.ray + 0xd8) & auVar51._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar51._12_4_ & uVar79 | *(uint *)(args.ray + 0xdc) & auVar51._12_4_;
                    auVar97._0_4_ = *(uint *)(args.ray + 0xe0) & auVar51._0_4_;
                    auVar97._4_4_ = *(uint *)(args.ray + 0xe4) & auVar51._4_4_;
                    auVar97._8_4_ = *(uint *)(args.ray + 0xe8) & auVar51._8_4_;
                    auVar97._12_4_ = *(uint *)(args.ray + 0xec) & auVar51._12_4_;
                    auVar87._0_4_ = ~auVar51._0_4_ & *(uint *)(args.hit + 0x20);
                    auVar87._4_4_ = ~auVar51._4_4_ & *(uint *)(args.hit + 0x24);
                    auVar87._8_4_ = ~auVar51._8_4_ & *(uint *)(args.hit + 0x28);
                    auVar87._12_4_ = ~auVar51._12_4_ & *(uint *)(args.hit + 0x2c);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar87 | auVar97;
                    auVar103._0_4_ = *(uint *)(args.ray + 0xf0) & auVar51._0_4_;
                    auVar103._4_4_ = *(uint *)(args.ray + 0xf4) & auVar51._4_4_;
                    auVar103._8_4_ = *(uint *)(args.ray + 0xf8) & auVar51._8_4_;
                    auVar103._12_4_ = *(uint *)(args.ray + 0xfc) & auVar51._12_4_;
                    auVar88._0_4_ = ~auVar51._0_4_ & *(uint *)(args.hit + 0x30);
                    auVar88._4_4_ = ~auVar51._4_4_ & *(uint *)(args.hit + 0x34);
                    auVar88._8_4_ = ~auVar51._8_4_ & *(uint *)(args.hit + 0x38);
                    auVar88._12_4_ = ~auVar51._12_4_ & *(uint *)(args.hit + 0x3c);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar88 | auVar103;
                    uVar60 = *(uint *)(args.hit + 0x44);
                    uVar77 = *(uint *)(args.hit + 0x48);
                    uVar79 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar51._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar51._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar51._4_4_ & uVar60 | *(uint *)(args.ray + 0x104) & auVar51._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar51._8_4_ & uVar77 | *(uint *)(args.ray + 0x108) & auVar51._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar51._12_4_ & uVar79 | *(uint *)(args.ray + 0x10c) & auVar51._12_4_;
                    uVar60 = *(uint *)(args.hit + 0x54);
                    uVar77 = *(uint *)(args.hit + 0x58);
                    uVar79 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar51._0_4_ |
                         ~auVar51._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar51._4_4_ | ~auVar51._4_4_ & uVar60;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar51._8_4_ | ~auVar51._8_4_ & uVar77;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar51._12_4_ | ~auVar51._12_4_ & uVar79;
                    uVar60 = *(uint *)(args.hit + 100);
                    uVar77 = *(uint *)(args.hit + 0x68);
                    uVar79 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar51._0_4_ |
                         ~auVar51._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar51._4_4_ | ~auVar51._4_4_ & uVar60;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar51._8_4_ | ~auVar51._8_4_ & uVar77;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar51._12_4_ | ~auVar51._12_4_ & uVar79;
                    uVar60 = *(uint *)(args.hit + 0x74);
                    uVar77 = *(uint *)(args.hit + 0x78);
                    uVar79 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar51._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar51._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar51._4_4_ & uVar60 | *(uint *)(args.ray + 0x134) & auVar51._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar51._8_4_ & uVar77 | *(uint *)(args.ray + 0x138) & auVar51._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar51._12_4_ & uVar79 | *(uint *)(args.ray + 0x13c) & auVar51._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar51 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar51;
                    pRVar27 = args.ray;
                  }
                }
                auVar75._0_4_ = auVar71._0_4_ << 0x1f;
                auVar75._4_4_ = auVar71._4_4_ << 0x1f;
                auVar75._8_4_ = auVar71._8_4_ << 0x1f;
                auVar75._12_4_ = auVar71._12_4_ << 0x1f;
                iVar22 = movmskps((int)pRVar27,auVar75);
                uVar25 = CONCAT44((int)((ulong)pRVar27 >> 0x20),iVar22);
                if (iVar22 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar53;
                }
                else {
                  fVar53 = *(float *)(ray + k * 4 + 0x80);
                }
                *(undefined4 *)(local_238 + lVar30 * 4 + -0x10) = 0;
                valid.field_0.i[0] = -(uint)(fVar93 <= fVar53) & valid.field_0.i[0];
                valid.field_0.i[1] = -(uint)(fVar107 <= fVar53) & valid.field_0.i[1];
                valid.field_0.i[2] = -(uint)(fVar108 <= fVar53) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fVar109 <= fVar53) & valid.field_0.i[3];
              }
              iVar22 = movmskps((int)uVar25,(undefined1  [16])valid.field_0);
              if (iVar22 == 0) {
                return;
              }
              uVar60 = valid.field_0._0_4_;
              uVar77 = valid.field_0._4_4_;
              uVar79 = valid.field_0._8_4_;
              uVar81 = valid.field_0._12_4_;
              auVar72._0_4_ = uVar60 & (uint)fVar93;
              auVar72._4_4_ = uVar77 & (uint)fVar107;
              auVar72._8_4_ = uVar79 & (uint)fVar108;
              auVar72._12_4_ = uVar81 & (uint)fVar109;
              auVar89._0_8_ = CONCAT44(~uVar77,~uVar60) & 0x7f8000007f800000;
              auVar89._8_4_ = ~uVar79 & 0x7f800000;
              auVar89._12_4_ = ~uVar81 & 0x7f800000;
              auVar89 = auVar89 | auVar72;
              auVar92._4_4_ = auVar89._0_4_;
              auVar92._0_4_ = auVar89._4_4_;
              auVar92._8_4_ = auVar89._12_4_;
              auVar92._12_4_ = auVar89._8_4_;
              auVar102 = minps(auVar92,auVar89);
              auVar73._0_8_ = auVar102._8_8_;
              auVar73._8_4_ = auVar102._0_4_;
              auVar73._12_4_ = auVar102._4_4_;
              auVar102 = minps(auVar73,auVar102);
              auVar74._0_8_ =
                   CONCAT44(-(uint)(auVar102._4_4_ == auVar89._4_4_) & uVar77,
                            -(uint)(auVar102._0_4_ == auVar89._0_4_) & uVar60);
              auVar74._8_4_ = -(uint)(auVar102._8_4_ == auVar89._8_4_) & uVar79;
              auVar74._12_4_ = -(uint)(auVar102._12_4_ == auVar89._12_4_) & uVar81;
              iVar22 = movmskps(iVar22,auVar74);
              aVar52 = valid.field_0;
              if (iVar22 != 0) {
                aVar52.i[2] = auVar74._8_4_;
                aVar52._0_8_ = auVar74._0_8_;
                aVar52.i[3] = auVar74._12_4_;
              }
              uVar24 = movmskps(iVar22,(undefined1  [16])aVar52);
              uVar25 = CONCAT44((int)(uVar25 >> 0x20),uVar24);
              lVar30 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
            } while( true );
          }
          h.primID.field_0.i[0] = *(uint *)((long)&(sphere->primIDs).field_0 + lVar30 * 4);
          h.Ng.field_0._0_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4);
          h.Ng.field_0._16_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x10);
          h.Ng.field_0._36_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + lVar30 * 4 + 0x20);
          h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
          h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
          h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
          h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
          h.Ng.field_0._32_4_ = h.Ng.field_0._36_4_;
          h.Ng.field_0._40_4_ = h.Ng.field_0._36_4_;
          h.Ng.field_0._44_4_ = h.Ng.field_0._36_4_;
          h.v.field_0._0_8_ = 0;
          h.v.field_0._8_8_ = 0;
          h.u.field_0._0_8_ = 0;
          h.u.field_0._8_8_ = 0;
          h.primID.field_0.i[1] = h.primID.field_0.i[0];
          h.primID.field_0.i[2] = h.primID.field_0.i[0];
          h.primID.field_0.i[3] = h.primID.field_0.i[0];
          h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
          h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
          h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
          h.instID[0].field_0.i[0] = context->user->instID[0];
          h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
          h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
          h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
          h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
          h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar30];
          local_238 = *pauVar32;
          args.geometryUserPtr = pGVar10->userPtr;
          args.context = context->user;
          args.N = 4;
          p_Var26 = pGVar10->intersectionFilterN;
          local_228 = fVar93;
          fStack_224 = fVar107;
          fStack_220 = fVar108;
          fStack_21c = fVar109;
          if (p_Var26 != (RTCFilterFunctionN)0x0) {
            local_208 = pauVar32;
            p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&args);
            pauVar32 = local_208;
            pSVar34 = local_200;
          }
          auVar64._0_4_ = -(uint)(local_238._0_4_ == 0);
          auVar64._4_4_ = -(uint)(local_238._4_4_ == 0);
          auVar64._8_4_ = -(uint)(local_238._8_4_ == 0);
          auVar64._12_4_ = -(uint)(local_238._12_4_ == 0);
          uVar60 = movmskps((int)p_Var26,auVar64);
          pRVar27 = (RTCRayN *)(ulong)(uVar60 ^ 0xf);
          if ((uVar60 ^ 0xf) == 0) {
            auVar64 = auVar64 ^ _DAT_01f46b70;
            fVar93 = local_228;
            fVar107 = fStack_224;
            fVar108 = fStack_220;
            fVar109 = fStack_21c;
          }
          else {
            p_Var26 = context->args->filter;
            if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var26 = (RTCFilterFunctionN)(*p_Var26)(&args);
              pSVar34 = local_200;
            }
            auVar46._0_4_ = -(uint)(local_238._0_4_ == 0);
            auVar46._4_4_ = -(uint)(local_238._4_4_ == 0);
            auVar46._8_4_ = -(uint)(local_238._8_4_ == 0);
            auVar46._12_4_ = -(uint)(local_238._12_4_ == 0);
            auVar64 = auVar46 ^ _DAT_01f46b70;
            uVar60 = movmskps((int)p_Var26,auVar46);
            pRVar27 = (RTCRayN *)(ulong)(uVar60 ^ 0xf);
            fVar93 = local_228;
            fVar107 = fStack_224;
            fVar108 = fStack_220;
            fVar109 = fStack_21c;
            if ((uVar60 ^ 0xf) != 0) {
              uVar60 = *(uint *)(args.hit + 4);
              uVar77 = *(uint *)(args.hit + 8);
              uVar79 = *(uint *)(args.hit + 0xc);
              *(uint *)(args.ray + 0xc0) =
                   ~auVar46._0_4_ & *(uint *)args.hit | *(uint *)(args.ray + 0xc0) & auVar46._0_4_;
              *(uint *)(args.ray + 0xc4) =
                   ~auVar46._4_4_ & uVar60 | *(uint *)(args.ray + 0xc4) & auVar46._4_4_;
              *(uint *)(args.ray + 200) =
                   ~auVar46._8_4_ & uVar77 | *(uint *)(args.ray + 200) & auVar46._8_4_;
              *(uint *)(args.ray + 0xcc) =
                   ~auVar46._12_4_ & uVar79 | *(uint *)(args.ray + 0xcc) & auVar46._12_4_;
              uVar60 = *(uint *)(args.hit + 0x14);
              uVar77 = *(uint *)(args.hit + 0x18);
              uVar79 = *(uint *)(args.hit + 0x1c);
              *(uint *)(args.ray + 0xd0) =
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x10) |
                   *(uint *)(args.ray + 0xd0) & auVar46._0_4_;
              *(uint *)(args.ray + 0xd4) =
                   ~auVar46._4_4_ & uVar60 | *(uint *)(args.ray + 0xd4) & auVar46._4_4_;
              *(uint *)(args.ray + 0xd8) =
                   ~auVar46._8_4_ & uVar77 | *(uint *)(args.ray + 0xd8) & auVar46._8_4_;
              *(uint *)(args.ray + 0xdc) =
                   ~auVar46._12_4_ & uVar79 | *(uint *)(args.ray + 0xdc) & auVar46._12_4_;
              uVar60 = *(uint *)(args.hit + 0x24);
              uVar77 = *(uint *)(args.hit + 0x28);
              uVar79 = *(uint *)(args.hit + 0x2c);
              *(uint *)(args.ray + 0xe0) =
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x20) |
                   *(uint *)(args.ray + 0xe0) & auVar46._0_4_;
              *(uint *)(args.ray + 0xe4) =
                   ~auVar46._4_4_ & uVar60 | *(uint *)(args.ray + 0xe4) & auVar46._4_4_;
              *(uint *)(args.ray + 0xe8) =
                   ~auVar46._8_4_ & uVar77 | *(uint *)(args.ray + 0xe8) & auVar46._8_4_;
              *(uint *)(args.ray + 0xec) =
                   ~auVar46._12_4_ & uVar79 | *(uint *)(args.ray + 0xec) & auVar46._12_4_;
              uVar60 = *(uint *)(args.hit + 0x34);
              uVar77 = *(uint *)(args.hit + 0x38);
              uVar79 = *(uint *)(args.hit + 0x3c);
              *(uint *)(args.ray + 0xf0) =
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x30) |
                   *(uint *)(args.ray + 0xf0) & auVar46._0_4_;
              *(uint *)(args.ray + 0xf4) =
                   ~auVar46._4_4_ & uVar60 | *(uint *)(args.ray + 0xf4) & auVar46._4_4_;
              *(uint *)(args.ray + 0xf8) =
                   ~auVar46._8_4_ & uVar77 | *(uint *)(args.ray + 0xf8) & auVar46._8_4_;
              *(uint *)(args.ray + 0xfc) =
                   ~auVar46._12_4_ & uVar79 | *(uint *)(args.ray + 0xfc) & auVar46._12_4_;
              uVar60 = *(uint *)(args.hit + 0x44);
              uVar77 = *(uint *)(args.hit + 0x48);
              uVar79 = *(uint *)(args.hit + 0x4c);
              *(uint *)(args.ray + 0x100) =
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x40) |
                   *(uint *)(args.ray + 0x100) & auVar46._0_4_;
              *(uint *)(args.ray + 0x104) =
                   ~auVar46._4_4_ & uVar60 | *(uint *)(args.ray + 0x104) & auVar46._4_4_;
              *(uint *)(args.ray + 0x108) =
                   ~auVar46._8_4_ & uVar77 | *(uint *)(args.ray + 0x108) & auVar46._8_4_;
              *(uint *)(args.ray + 0x10c) =
                   ~auVar46._12_4_ & uVar79 | *(uint *)(args.ray + 0x10c) & auVar46._12_4_;
              uVar60 = *(uint *)(args.hit + 0x54);
              uVar77 = *(uint *)(args.hit + 0x58);
              uVar79 = *(uint *)(args.hit + 0x5c);
              *(uint *)(args.ray + 0x110) =
                   *(uint *)(args.ray + 0x110) & auVar46._0_4_ |
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x50);
              *(uint *)(args.ray + 0x114) =
                   *(uint *)(args.ray + 0x114) & auVar46._4_4_ | ~auVar46._4_4_ & uVar60;
              *(uint *)(args.ray + 0x118) =
                   *(uint *)(args.ray + 0x118) & auVar46._8_4_ | ~auVar46._8_4_ & uVar77;
              *(uint *)(args.ray + 0x11c) =
                   *(uint *)(args.ray + 0x11c) & auVar46._12_4_ | ~auVar46._12_4_ & uVar79;
              uVar60 = *(uint *)(args.hit + 100);
              uVar77 = *(uint *)(args.hit + 0x68);
              uVar79 = *(uint *)(args.hit + 0x6c);
              *(uint *)(args.ray + 0x120) =
                   *(uint *)(args.ray + 0x120) & auVar46._0_4_ |
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x60);
              *(uint *)(args.ray + 0x124) =
                   *(uint *)(args.ray + 0x124) & auVar46._4_4_ | ~auVar46._4_4_ & uVar60;
              *(uint *)(args.ray + 0x128) =
                   *(uint *)(args.ray + 0x128) & auVar46._8_4_ | ~auVar46._8_4_ & uVar77;
              *(uint *)(args.ray + 300) =
                   *(uint *)(args.ray + 300) & auVar46._12_4_ | ~auVar46._12_4_ & uVar79;
              uVar60 = *(uint *)(args.hit + 0x74);
              uVar77 = *(uint *)(args.hit + 0x78);
              uVar79 = *(uint *)(args.hit + 0x7c);
              *(uint *)(args.ray + 0x130) =
                   ~auVar46._0_4_ & *(uint *)(args.hit + 0x70) |
                   *(uint *)(args.ray + 0x130) & auVar46._0_4_;
              *(uint *)(args.ray + 0x134) =
                   ~auVar46._4_4_ & uVar60 | *(uint *)(args.ray + 0x134) & auVar46._4_4_;
              *(uint *)(args.ray + 0x138) =
                   ~auVar46._8_4_ & uVar77 | *(uint *)(args.ray + 0x138) & auVar46._8_4_;
              *(uint *)(args.ray + 0x13c) =
                   ~auVar46._12_4_ & uVar79 | *(uint *)(args.ray + 0x13c) & auVar46._12_4_;
              *(undefined1 (*) [16])(args.ray + 0x140) =
                   ~auVar46 & *(undefined1 (*) [16])(args.hit + 0x80) |
                   *(undefined1 (*) [16])(args.ray + 0x140) & auVar46;
              pRVar27 = args.ray;
            }
          }
          auVar68._0_4_ = auVar64._0_4_ << 0x1f;
          auVar68._4_4_ = auVar64._4_4_ << 0x1f;
          auVar68._8_4_ = auVar64._8_4_ << 0x1f;
          auVar68._12_4_ = auVar64._12_4_ << 0x1f;
          iVar22 = movmskps((int)pRVar27,auVar68);
          uVar25 = CONCAT44((int)((ulong)pRVar27 >> 0x20),iVar22);
          if (iVar22 == 0) {
            *(float *)(ray + k * 4 + 0x80) = fVar53;
          }
          else {
            fVar53 = *(float *)(ray + k * 4 + 0x80);
          }
          *(undefined4 *)(local_238 + lVar30 * 4 + -0x10) = 0;
          valid.field_0.i[0] = -(uint)((float)local_218._0_4_ <= fVar53) & valid.field_0.i[0];
          valid.field_0.i[1] = -(uint)((float)local_218._4_4_ <= fVar53) & valid.field_0.i[1];
          valid.field_0.i[2] = -(uint)(fStack_210 <= fVar53) & valid.field_0.i[2];
          valid.field_0.i[3] = -(uint)(fStack_20c <= fVar53) & valid.field_0.i[3];
        }
        uVar24 = (undefined4)(uVar25 >> 0x20);
        uVar60 = movmskps((int)uVar25,(undefined1  [16])valid.field_0);
        if (uVar60 == 0) goto LAB_0033f92e;
        uVar77 = valid.field_0._0_4_;
        uVar79 = valid.field_0._4_4_;
        uVar81 = valid.field_0._8_4_;
        uVar36 = valid.field_0._12_4_;
        auVar65._0_4_ = uVar77 & local_218._0_4_;
        auVar65._4_4_ = uVar79 & local_218._4_4_;
        auVar65._8_4_ = uVar81 & (uint)fStack_210;
        auVar65._12_4_ = uVar36 & (uint)fStack_20c;
        auVar84._0_8_ = CONCAT44(~uVar79,~uVar77) & 0x7f8000007f800000;
        auVar84._8_4_ = ~uVar81 & 0x7f800000;
        auVar84._12_4_ = ~uVar36 & 0x7f800000;
        auVar84 = auVar84 | auVar65;
        auVar91._4_4_ = auVar84._0_4_;
        auVar91._0_4_ = auVar84._4_4_;
        auVar91._8_4_ = auVar84._12_4_;
        auVar91._12_4_ = auVar84._8_4_;
        auVar102 = minps(auVar91,auVar84);
        auVar66._0_8_ = auVar102._8_8_;
        auVar66._8_4_ = auVar102._0_4_;
        auVar66._12_4_ = auVar102._4_4_;
        auVar102 = minps(auVar66,auVar102);
        auVar67._0_8_ =
             CONCAT44(-(uint)(auVar102._4_4_ == auVar84._4_4_) & uVar79,
                      -(uint)(auVar102._0_4_ == auVar84._0_4_) & uVar77);
        auVar67._8_4_ = -(uint)(auVar102._8_4_ == auVar84._8_4_) & uVar81;
        auVar67._12_4_ = -(uint)(auVar102._12_4_ == auVar84._12_4_) & uVar36;
        iVar22 = movmskps(uVar60,auVar67);
        aVar47 = valid.field_0;
        if (iVar22 != 0) {
          aVar47.i[2] = auVar67._8_4_;
          aVar47._0_8_ = auVar67._0_8_;
          aVar47.i[3] = auVar67._12_4_;
        }
        uVar23 = movmskps(iVar22,(undefined1  [16])aVar47);
        lVar30 = 0;
        if (CONCAT44(uVar24,uVar23) != 0) {
          for (; (CONCAT44(uVar24,uVar23) >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }